

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitCompoundLiteralExpression
          (SyntaxDumper *this,CompoundLiteralExpressionSyntax *node)

{
  CompoundLiteralExpressionSyntax local_50 [56];
  
  CompoundLiteralExpressionSyntax::openParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  CompoundLiteralExpressionSyntax::closeParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x40));
  return Skip;
}

Assistant:

virtual Action visitCompoundLiteralExpression(const CompoundLiteralExpressionSyntax* node) override
    {
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->initializer());
        return Action::Skip;
    }